

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O1

json __thiscall nlohmann::json_schema::json_validator::validate(json_validator *this,json *instance)

{
  error_handler *in_RDX;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value jVar1;
  json jVar2;
  throwing_error_handler err;
  undefined1 local_108 [224];
  
  local_108._0_8_ = &PTR__error_handler_0015aa30;
  local_108._8_8_ = local_108 + 0x18;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_108 + 8),"#","");
  json_uri::json_uri((json_uri *)(local_108 + 0x28),(string *)(local_108 + 8));
  validate(this,instance,in_RDX,(json_uri *)local_108);
  json_uri::~json_uri((json_uri *)(local_108 + 0x28));
  jVar1 = extraout_RDX;
  if ((undefined1 *)local_108._8_8_ != local_108 + 0x18) {
    operator_delete((void *)local_108._8_8_,local_108._24_8_ + 1);
    jVar1 = extraout_RDX_00;
  }
  jVar2.m_value.object = jVar1.object;
  jVar2._0_8_ = this;
  return jVar2;
}

Assistant:

json json_validator::validate(const json &instance) const
{
	throwing_error_handler err;
	return validate(instance, err);
}